

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorPool::Tables::Tables(Tables *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  *local_378;
  WellKnownType local_2f8 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  *local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_58;
  iterator local_30;
  size_type local_28;
  Tables *local_10;
  Tables *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->pending_files_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->known_bad_files_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->known_bad_symbols_);
  std::
  unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::unordered_set(&this->extensions_loaded_from_db_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::unordered_map(&this->well_known_types_);
  anon_unknown_1::TableArena::TableArena(&this->arena_);
  std::
  unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  ::unordered_set(&this->symbols_by_name_);
  std::
  unordered_map<google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>_>
  ::unordered_map(&this->files_by_name_);
  std::
  map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::map(&this->extensions_);
  std::
  vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ::vector(&this->checkpoints_);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->symbols_after_checkpoint_)
  ;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->files_after_checkpoint_);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::vector(&this->extensions_after_checkpoint_);
  local_2b8 = &local_2b0;
  local_2f8[0xf] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[28],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [28])"google.protobuf.DoubleValue",local_2f8 + 0xf);
  local_2b8 = &local_288;
  local_2f8[0xe] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[27],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [27])"google.protobuf.FloatValue",local_2f8 + 0xe);
  local_2b8 = &local_260;
  local_2f8[0xd] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[27],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [27])"google.protobuf.Int64Value",local_2f8 + 0xd);
  local_2b8 = &local_238;
  local_2f8[0xc] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[28],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [28])"google.protobuf.UInt64Value",local_2f8 + 0xc);
  local_2b8 = &local_210;
  local_2f8[0xb] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[27],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [27])"google.protobuf.Int32Value",local_2f8 + 0xb);
  local_2b8 = &local_1e8;
  local_2f8[10] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[28],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [28])"google.protobuf.UInt32Value",local_2f8 + 10);
  local_2b8 = &local_1c0;
  local_2f8[9] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[28],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [28])"google.protobuf.StringValue",local_2f8 + 9);
  local_2b8 = &local_198;
  local_2f8[8] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[27],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [27])"google.protobuf.BytesValue",local_2f8 + 8);
  local_2b8 = &local_170;
  local_2f8[7] = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[26],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [26])"google.protobuf.BoolValue",local_2f8 + 7);
  local_2b8 = &local_148;
  local_2f8[6] = 10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[20],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [20])"google.protobuf.Any",local_2f8 + 6);
  local_2b8 = &local_120;
  local_2f8[5] = 0xb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[26],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [26])"google.protobuf.FieldMask",local_2f8 + 5);
  local_2b8 = &local_f8;
  local_2f8[4] = 0xc;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[25],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [25])"google.protobuf.Duration",local_2f8 + 4);
  local_2b8 = &local_d0;
  local_2f8[3] = 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[26],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [26])"google.protobuf.Timestamp",local_2f8 + 3);
  local_2b8 = &local_a8;
  local_2f8[2] = 0xe;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[22],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [22])"google.protobuf.Value",local_2f8 + 2);
  local_2b8 = &local_80;
  local_2f8[1] = 0xf;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[26],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [26])"google.protobuf.ListValue",local_2f8 + 1);
  local_2b8 = &local_58;
  local_2f8[0] = WELLKNOWNTYPE_STRUCT;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[23],_google::protobuf::Descriptor::WellKnownType,_true>
            (local_2b8,(char (*) [23])"google.protobuf.Struct",local_2f8);
  local_30 = &local_2b0;
  local_28 = 0x10;
  __l._M_len = 0x10;
  __l._M_array = local_30;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::insert(&this->well_known_types_,__l);
  local_378 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
               *)&local_30;
  do {
    local_378 = local_378 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
    ::~pair(local_378);
  } while (local_378 != &local_2b0);
  return;
}

Assistant:

DescriptorPool::Tables::Tables() {
  well_known_types_.insert({
      {"google.protobuf.DoubleValue", Descriptor::WELLKNOWNTYPE_DOUBLEVALUE},
      {"google.protobuf.FloatValue", Descriptor::WELLKNOWNTYPE_FLOATVALUE},
      {"google.protobuf.Int64Value", Descriptor::WELLKNOWNTYPE_INT64VALUE},
      {"google.protobuf.UInt64Value", Descriptor::WELLKNOWNTYPE_UINT64VALUE},
      {"google.protobuf.Int32Value", Descriptor::WELLKNOWNTYPE_INT32VALUE},
      {"google.protobuf.UInt32Value", Descriptor::WELLKNOWNTYPE_UINT32VALUE},
      {"google.protobuf.StringValue", Descriptor::WELLKNOWNTYPE_STRINGVALUE},
      {"google.protobuf.BytesValue", Descriptor::WELLKNOWNTYPE_BYTESVALUE},
      {"google.protobuf.BoolValue", Descriptor::WELLKNOWNTYPE_BOOLVALUE},
      {"google.protobuf.Any", Descriptor::WELLKNOWNTYPE_ANY},
      {"google.protobuf.FieldMask", Descriptor::WELLKNOWNTYPE_FIELDMASK},
      {"google.protobuf.Duration", Descriptor::WELLKNOWNTYPE_DURATION},
      {"google.protobuf.Timestamp", Descriptor::WELLKNOWNTYPE_TIMESTAMP},
      {"google.protobuf.Value", Descriptor::WELLKNOWNTYPE_VALUE},
      {"google.protobuf.ListValue", Descriptor::WELLKNOWNTYPE_LISTVALUE},
      {"google.protobuf.Struct", Descriptor::WELLKNOWNTYPE_STRUCT},
  });
}